

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hashutil.cpp
# Opt level: O3

void __thiscall HashUtil_operator_Test::TestBody(HashUtil_operator_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  HashUtil hash_util;
  HashUtil hash_util2;
  ByteData target;
  AssertHelper local_c0 [3];
  internal local_a8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  HashUtil local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  HashUtil local_50;
  ByteData local_28;
  
  local_98._vptr_HashUtil = (_func_int **)&local_98.buffer_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,
             "21026dccc749adc2a9d0d89497ac511f760f45c47dc5ed9cf352a58ac706453880aeadab210255a9626aebf5e29c0e6538428ba0d1dcf6ca98ffdf086aa8ced5e0d0215ea465ac"
             ,"");
  cfd::core::ByteData::ByteData(&local_28,(string *)&local_98);
  if ((ByteData *)local_98._vptr_HashUtil != &local_98.buffer_) {
    operator_delete(local_98._vptr_HashUtil);
  }
  cfd::core::HashUtil::HashUtil(&local_98,'\x05');
  cfd::core::ByteData::GetBytes();
  cfd::core::HashUtil::operator<<(&local_98,(vector *)&local_50);
  if (local_50._vptr_HashUtil != (_func_int **)0x0) {
    operator_delete(local_50._vptr_HashUtil);
  }
  cfd::core::HashUtil::HashUtil(&local_50,'\x05');
  cfd::core::HashUtil::operator=(&local_50,&local_98);
  cfd::core::HashUtil::Output();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[129]>
            (local_a8,"hash_util2.Output().GetHex()",
             "\"7ad6132c2611fd0496ad42c758edc1bc2a23c3a4c463e139e144e25c35a53765c4c4c99d68d821a1bdd71b10e88afebdba72bfa0ae3877f628f1e2eab5320229\""
             ,&local_70,
             (char (*) [129])
             "7ad6132c2611fd0496ad42c758edc1bc2a23c3a4c463e139e144e25c35a53765c4c4c99d68d821a1bdd71b10e88afebdba72bfa0ae3877f628f1e2eab5320229"
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_c0[0].data_ != (AssertHelperData *)0x0) {
    operator_delete(local_c0[0].data_);
  }
  if (local_a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_70);
    if (local_a0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_a0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_hashutil.cpp"
               ,0x15c,message);
    testing::internal::AssertHelper::operator=(local_c0,(Message *)&local_70);
    testing::internal::AssertHelper::~AssertHelper(local_c0);
    if ((long *)local_70._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_70._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_70._M_dataplus._M_p + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_50._vptr_HashUtil = (_func_int **)&PTR__HashUtil_004cf408;
  if (local_50.buffer_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.buffer_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_98._vptr_HashUtil = (_func_int **)&PTR__HashUtil_004cf408;
  if (local_98.buffer_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.buffer_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_28.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(HashUtil, Sha256BytePubkey) {
  Pubkey target(
      "032f061438c62aa9a1685d7451a4bf1af8d0b8c132b0db4614147df19b687c01db");
  ByteData256 byte_data = HashUtil::Sha256(target);
  EXPECT_STREQ(
      byte_data.GetHex().c_str(),
      "2213d0c45bf1ece1a9b0c2d5a21d603601e88e22ae2786fe3f0060ee4aad321d");
}